

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O1

void __thiscall
CompileScriptException::CopyInto(CompileScriptException *this,CompileScriptException *pse)

{
  UINT len;
  BSTR pWVar1;
  
  (pse->super_ScriptException).ichMin = (this->super_ScriptException).ichMin;
  (pse->super_ScriptException).ichLim = (this->super_ScriptException).ichLim;
  CopyException(&(pse->super_ScriptException).ei,&(this->super_ScriptException).ei);
  pse->line = this->line;
  pse->ichMinLine = this->ichMinLine;
  pse->hasLineNumberInfo = this->hasLineNumberInfo;
  pWVar1 = this->bstrLine;
  if (pWVar1 != (BSTR)0x0) {
    len = SysStringLen(pWVar1);
    pWVar1 = SysAllocStringLen(pWVar1,len);
    pse->bstrLine = pWVar1;
  }
  return;
}

Assistant:

void CompileScriptException::CopyInto(CompileScriptException* pse)
{
    ScriptException::CopyInto(pse);

    pse->line = this->line;
    pse->ichMinLine = this->ichMinLine;
    pse->hasLineNumberInfo = this->hasLineNumberInfo;

    if (this->bstrLine)
    {
        pse->bstrLine = SysAllocStringLen(this->bstrLine, SysStringLen(this->bstrLine));
    }
}